

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCut.c
# Opt level: O3

Map_Cut_t * Map_CutTableConsider(Map_Man_t *pMan,Map_CutTable_t *p,Map_Node_t **ppNodes,int nNodes)

{
  int iVar1;
  uint uVar2;
  Map_Cut_t *pMVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar8 = (ulong)(uint)nNodes;
  if (nNodes < 1) {
    uVar2 = 0;
  }
  else {
    lVar6 = 0;
    uVar2 = 0;
    do {
      uVar2 = uVar2 + *(int *)(*(long *)((long)ppNodes + lVar6 * 2) + 0x10) *
                      *(int *)((long)s_HashPrimes + lVar6);
      lVar6 = lVar6 + 4;
    } while (uVar8 * 4 - lVar6 != 0);
  }
  uVar4 = (ulong)uVar2 % (ulong)(uint)p->nBins;
  iVar5 = (int)uVar4;
  pMVar3 = p->pBins[iVar5];
  if (pMVar3 != (Map_Cut_t *)0x0) {
    do {
      if (pMVar3->nLeaves == nNodes) {
        uVar7 = 0;
        if (0 < nNodes) {
          while (pMVar3->ppLeaves[uVar7] == ppNodes[uVar7]) {
            uVar7 = uVar7 + 1;
            if (uVar8 == uVar7) {
              return (Map_Cut_t *)0x0;
            }
          }
        }
        if ((int)uVar7 == nNodes) {
          return (Map_Cut_t *)0x0;
        }
      }
      uVar4 = (long)((int)uVar4 + 1) % (long)p->nBins;
      iVar5 = (int)uVar4;
      uVar4 = uVar4 & 0xffffffff;
      pMVar3 = p->pBins[iVar5];
    } while (pMVar3 != (Map_Cut_t *)0x0);
    if (iVar5 == -1) {
      return (Map_Cut_t *)0x0;
    }
  }
  if (nNodes < 1) {
    __assert_fail("nNodes > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperCut.c"
                  ,0x3a0,
                  "Map_Cut_t *Map_CutTableConsider(Map_Man_t *, Map_CutTable_t *, Map_Node_t **, int)"
                 );
  }
  pMVar3 = Map_CutAlloc(pMan);
  pMVar3->nLeaves = (char)nNodes;
  uVar4 = 0;
  do {
    pMVar3->ppLeaves[uVar4] = ppNodes[uVar4];
    uVar4 = uVar4 + 1;
  } while (uVar8 != uVar4);
  if (p->pBins[iVar5] != (Map_Cut_t *)0x0) {
    __assert_fail("p->pBins[Place] == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperCut.c"
                  ,0x3a9,
                  "Map_Cut_t *Map_CutTableConsider(Map_Man_t *, Map_CutTable_t *, Map_Node_t **, int)"
                 );
  }
  p->pBins[iVar5] = pMVar3;
  iVar1 = p->nCuts;
  p->nCuts = iVar1 + 1;
  p->pCuts[iVar1] = iVar5;
  return pMVar3;
}

Assistant:

Map_Cut_t * Map_CutTableConsider( Map_Man_t * pMan, Map_CutTable_t * p, Map_Node_t * ppNodes[], int nNodes )
{
    Map_Cut_t * pCut;
    int Place, i;
//    abctime clk;
    // check the cut
    Place = Map_CutTableLookup( p, ppNodes, nNodes );
    if ( Place == -1 )
        return NULL;
    assert( nNodes > 0 );
    // create the new cut
//clk = Abc_Clock();
    pCut = Map_CutAlloc( pMan );
//pMan->time1 += Abc_Clock() - clk;
    pCut->nLeaves = nNodes;
    for ( i = 0; i < nNodes; i++ )
        pCut->ppLeaves[i] = ppNodes[i];
    // add the cut to the table
    assert( p->pBins[Place] == NULL );
    p->pBins[Place] = pCut;
    // add the cut to the new list
    p->pCuts[ p->nCuts++ ] = Place;
    return pCut;
}